

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

double __thiscall xt::vector::conj(vector *this,double __z)

{
  Object *in_RSI;
  double __z_00;
  double extraout_XMM0_Qa;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Object local_30;
  
  empty();
  Object::Object(&local_30,in_RSI);
  conj(__z_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return extraout_XMM0_Qa;
}

Assistant:

Vector conj(Object val) {
	return conj(empty(), val);
}